

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_page_search_root(MDB_cursor *mc,MDB_val *key,int flags)

{
  uint *puVar1;
  MDB_page *pMVar2;
  ushort uVar3;
  int iVar4;
  MDB_node *pMVar5;
  ulong uVar6;
  undefined8 in_R8;
  uint uVar7;
  MDB_page *mp;
  int exact;
  MDB_page *local_40;
  int local_34;
  
  local_40 = mc->mc_pg[mc->mc_top];
  uVar3 = local_40->mp_flags;
  if ((uVar3 & 1) != 0) {
    do {
      pMVar2 = local_40;
      iVar4 = (int)in_R8;
      if ((mc->mc_dbi != 0) && (((local_40->mp_pb).pb.pb_lower & 0xfffc) == 0x10)) {
        mdb_assert_fail(mc->mc_txn->mt_env,"!mc->mc_dbi || NUMKEYS(mp) > 1","mdb_page_search_root",
                        (char *)0x1789,iVar4);
      }
      if ((flags & 0xcU) == 0) {
        pMVar5 = mdb_node_search(mc,key,&local_34);
        if (pMVar5 == (MDB_node *)0x0) goto LAB_0010c5c2;
        uVar3 = mc->mc_ki[mc->mc_top];
        uVar6 = (ulong)uVar3;
        uVar7 = (uint)uVar3;
        if (local_34 != 0) goto LAB_0010c5d4;
        if (uVar3 == 0) {
          mdb_assert_fail(mc->mc_txn->mt_env,"i > 0","mdb_page_search_root",(char *)0x1798,iVar4);
        }
LAB_0010c5d1:
        uVar6 = (ulong)(uVar7 - 1);
      }
      else {
        if ((flags & 8U) != 0) {
LAB_0010c5c2:
          uVar7 = (pMVar2->mp_pb).pb.pb_lower + 0x1fff0 >> 1;
          goto LAB_0010c5d1;
        }
        uVar6 = 0;
      }
LAB_0010c5d4:
      if ((pMVar2->mp_pb).pb.pb_lower - 0x10 >> 1 <= (uint)(uVar6 & 0xffff)) {
        mdb_assert_fail(mc->mc_txn->mt_env,"i < NUMKEYS(mp)","mdb_page_search_root",(char *)0x179f,
                        iVar4);
      }
      in_R8 = 0;
      iVar4 = mdb_page_get((MDB_cursor *)mc->mc_txn,(ulong)mc->mc_flags,
                           (MDB_page **)
                           (ulong)CONCAT24(*(undefined2 *)
                                            ((long)pMVar2->mp_ptrs +
                                            ((ulong)pMVar2->mp_ptrs[uVar6 & 0xffff] - 0xc)),
                                           *(undefined4 *)
                                            ((long)pMVar2->mp_ptrs +
                                            ((ulong)pMVar2->mp_ptrs[uVar6 & 0xffff] - 0x10))),
                           (int *)&local_40);
      if (iVar4 != 0) {
        return iVar4;
      }
      mc->mc_ki[mc->mc_top] = (indx_t)uVar6;
      uVar3 = mc->mc_snum;
      uVar6 = (ulong)uVar3;
      if (0x1f < uVar6) {
        puVar1 = &mc->mc_txn->mt_flags;
        *puVar1 = *puVar1 | 2;
        return -0x7843;
      }
      mc->mc_snum = uVar3 + 1;
      mc->mc_top = uVar3;
      mc->mc_pg[uVar6] = local_40;
      mc->mc_ki[uVar6] = 0;
      if ((flags & 1U) != 0) {
        iVar4 = mdb_page_touch(mc);
        if (iVar4 != 0) {
          return iVar4;
        }
        local_40 = mc->mc_pg[mc->mc_top];
      }
      uVar3 = local_40->mp_flags;
    } while ((uVar3 & 1) != 0);
  }
  if ((uVar3 & 2) == 0) {
    puVar1 = &mc->mc_txn->mt_flags;
    *puVar1 = *puVar1 | 2;
    iVar4 = -0x784c;
  }
  else {
    mc->mc_flags = (mc->mc_flags & 0xfffffffc) + 1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
mdb_page_search_root(MDB_cursor *mc, MDB_val *key, int flags)
{
	MDB_page	*mp = mc->mc_pg[mc->mc_top];
	int rc;
	DKBUF;

	while (IS_BRANCH(mp)) {
		MDB_node	*node;
		indx_t		i;

		DPRINTF(("branch page %"Y"u has %u keys", mp->mp_pgno, NUMKEYS(mp)));
		/* Don't assert on branch pages in the FreeDB. We can get here
		 * while in the process of rebalancing a FreeDB branch page; we must
		 * let that proceed. ITS#8336
		 */
		mdb_cassert(mc, !mc->mc_dbi || NUMKEYS(mp) > 1);
		DPRINTF(("found index 0 to page %"Y"u", NODEPGNO(NODEPTR(mp, 0))));

		if (flags & (MDB_PS_FIRST|MDB_PS_LAST)) {
			i = 0;
			if (flags & MDB_PS_LAST)
				i = NUMKEYS(mp) - 1;
		} else {
			int	 exact;
			node = mdb_node_search(mc, key, &exact);
			if (node == NULL)
				i = NUMKEYS(mp) - 1;
			else {
				i = mc->mc_ki[mc->mc_top];
				if (!exact) {
					mdb_cassert(mc, i > 0);
					i--;
				}
			}
			DPRINTF(("following index %u for key [%s]", i, DKEY(key)));
		}

		mdb_cassert(mc, i < NUMKEYS(mp));
		node = NODEPTR(mp, i);

		if ((rc = mdb_page_get(mc, NODEPGNO(node), &mp, NULL)) != 0)
			return rc;

		mc->mc_ki[mc->mc_top] = i;
		if ((rc = mdb_cursor_push(mc, mp)))
			return rc;

		if (flags & MDB_PS_MODIFY) {
			if ((rc = mdb_page_touch(mc)) != 0)
				return rc;
			mp = mc->mc_pg[mc->mc_top];
		}
	}

	if (!IS_LEAF(mp)) {
		DPRINTF(("internal error, index points to a %02X page!?",
		    mp->mp_flags));
		mc->mc_txn->mt_flags |= MDB_TXN_ERROR;
		return MDB_CORRUPTED;
	}

	DPRINTF(("found leaf page %"Y"u for key [%s]", mp->mp_pgno,
	    key ? DKEY(key) : "null"));
	mc->mc_flags |= C_INITIALIZED;
	mc->mc_flags &= ~C_EOF;

	return MDB_SUCCESS;
}